

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint32_t farmhashmk::Hash32(char *s,size_t len)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar5 = (uint)len;
  if (0x18 < len) {
    auVar11._8_4_ = 0xcc9e2d51;
    auVar11._0_8_ = 0xcc9e2d51cc9e2d51;
    auVar11._12_4_ = 0xcc9e2d51;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(s + (len - 8));
    auVar10 = vpmulld_avx(auVar14,auVar11);
    auVar12 = vpsrld_avx(auVar10,0x11);
    auVar15._8_4_ = 0x16a88000;
    auVar15._0_8_ = 0x16a8800016a88000;
    auVar15._12_4_ = 0x16a88000;
    auVar10 = vpmulld_avx(auVar14,auVar15);
    auVar10 = vpor_avx(auVar12,auVar10);
    auVar13._8_4_ = 0x1b873593;
    auVar13._0_8_ = 0x1b8735931b873593;
    auVar13._12_4_ = 0x1b873593;
    auVar10 = vpshufd_avx(auVar10,0xe1);
    auVar14 = vpmulld_avx(auVar10,auVar13);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar10 = vpmulld_avx(auVar17,auVar11);
    auVar12 = vpsrld_avx(auVar10,0x11);
    auVar10 = vpmulld_avx(auVar17,auVar15);
    auVar10 = vpor_avx(auVar12,auVar10);
    auVar12 = vpmulld_avx(auVar10,auVar13);
    auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5 * -0x3361d2af,1);
    auVar10 = vprold_avx512vl(auVar14 ^ auVar10,0xd);
    auVar14 = vpslld_avx(auVar10,2);
    auVar16._8_4_ = 0xe6546b64;
    auVar16._0_8_ = 0xe6546b64e6546b64;
    auVar16._12_4_ = 0xe6546b64;
    auVar10 = vpaddd_avx(auVar10,auVar16);
    auVar10 = vpaddd_avx(auVar10,auVar14);
    auVar10 = vprold_avx512vl(auVar10 ^ auVar12,0xd);
    auVar14 = vpslld_avx(auVar10,2);
    auVar10 = vpaddd_avx(auVar10,auVar16);
    auVar10 = vpaddd_avx(auVar10,auVar14);
    uVar5 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
            uVar5 * -0x3361d2af;
    uVar5 = (uVar5 >> 0x13 | uVar5 * 0x2000) + 0x71;
    uVar3 = (len - 1) / 0x14;
    auVar12._8_4_ = 0xe6546b64;
    auVar12._0_8_ = 0xe6546b64e6546b64;
    auVar12._12_4_ = 0xe6546b64;
    do {
      iVar8 = *(int *)((long)s + 8);
      iVar1 = *(int *)((long)s + 0xc);
      uVar4 = (iVar1 * 0x16a88000 | (uint)(iVar1 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              auVar10._0_4_ + *(int *)s;
      uVar2 = (iVar8 * 0x16a88000 | (uint)(iVar8 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              auVar10._4_4_ + *(int *)((long)s + 4);
      iVar7 = (uVar2 >> 0x13 | uVar2 << 0xd) * 5 + *(int *)s;
      iVar9 = *(uint *)((long)s + 0x10) * -0x3361d2af + *(int *)((long)s + 4);
      uVar5 = (iVar9 * 0x16a88000 | (uint)(iVar9 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              uVar5 + iVar8;
      auVar10 = vpinsrd_avx(ZEXT416(*(uint *)((long)s + 0x10)),iVar1 + iVar7 + -0x33572938,1);
      auVar14 = vpinsrd_avx(auVar12,(uVar5 >> 0x13 | uVar5 << 0xd) * 5,1);
      auVar11 = vpinsrd_avx(ZEXT416((uVar4 >> 0x13 | uVar4 << 0xd) * 5),iVar7 + -0x19ab949c,1);
      auVar14 = vpaddd_avx(auVar10,auVar14);
      auVar10 = vpaddd_avx(auVar14,auVar11);
      s = (char *)((long)s + 0x14);
      uVar3 = uVar3 - 1;
      uVar5 = auVar14._4_4_;
    } while (uVar3 != 0);
    uVar2 = auVar10._4_4_ >> 0xb;
    uVar2 = auVar10._0_4_ +
            (uVar2 * 0x16a88000 | (uVar2 | auVar10._4_4_ << 0x15) * -0x3361d2af >> 0x11) *
            -0x3361d2af;
    uVar2 = (uVar2 >> 0x13 | uVar2 * 0x2000) * 5 + 0xe6546b64;
    iVar8 = (uVar2 >> 0x11 | uVar2 * 0x8000) +
            ((uVar5 >> 0xb) * 0x16a88000 | (uVar5 >> 0xb | uVar5 << 0x15) * -0x3361d2af >> 0x11);
    uVar5 = (iVar8 * -0x3a55e000 | (uint)(iVar8 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar5 >> 0x11 | uVar5 * 0x8000) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar2 = 0;
        uVar4 = 9;
      }
      else {
        uVar4 = 9;
        uVar2 = 0;
        sVar6 = 0;
        do {
          uVar2 = uVar2 * -0x3361d2af + (int)s[sVar6];
          uVar4 = uVar4 ^ uVar2;
          sVar6 = sVar6 + 1;
        } while (len != sVar6);
      }
      uVar4 = (uVar5 * 0x16a88000 | uVar5 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar4;
      uVar5 = uVar4 >> 0x13 | uVar4 << 0xd;
    }
    else {
      iVar8 = *(int *)(s + (len - 4)) + uVar5 * 5;
      uVar2 = *(int *)(s + (ulong)(uVar5 >> 3 & 1) * 4) + 9;
      uVar5 = ((*(int *)s + uVar5) * 0x16a88000 | (*(int *)s + uVar5) * -0x3361d2af >> 0x11) *
              0x1b873593 ^ uVar5 * 5;
      uVar5 = (iVar8 * 0x16a88000 | (uint)(iVar8 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
      uVar5 = uVar5 >> 0x13 | uVar5 << 0xd;
    }
    uVar5 = (uVar2 * 0x16a88000 | uVar2 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar5 * 5 + 0xe6546b64
    ;
    uVar5 = (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + 0xe6546b64;
    uVar5 = uVar5 >> 0x10 ^ uVar5;
  }
  else {
    iVar8 = *(int *)(s + (len - 8));
    uVar2 = (iVar8 * 0x16a88000 | (uint)(iVar8 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar5 + *(int *)(s + (len >> 1)) * -0x3361d2af;
    uVar5 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) +
            *(int *)(s + (len - 4));
    iVar8 = (uVar5 >> 3 | uVar5 * 0x20000000) + iVar8;
    uVar5 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar2 >> 0x13 | uVar2 << 0xd) * 5 + uVar5 + 0xe6546b64;
    uVar2 = iVar8 + *(int *)(s + (len - 4));
    uVar5 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ (uVar5 >> 0x13 | uVar5 << 0xd) * 5 + iVar8 + 0xe6546b64;
    uVar5 = (uVar2 >> 0xc | uVar2 * 0x100000) + *(int *)(s + (len >> 1)) + -0x19ab949c +
            (uVar5 >> 0x13 | uVar5 << 0xd) * 5;
    uVar5 = uVar5 >> 0x10 ^ uVar5;
  }
  uVar5 = (uVar5 * -0x7a143595 >> 0xd ^ uVar5 * -0x7a143595) * -0x3d4d51cb;
  return uVar5 >> 0x10 ^ uVar5;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = Rotate(Fetch(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate(Fetch(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate(Fetch(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate(Fetch(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate(Fetch(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate(f, 19) + 113;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a = Fetch(s);
    uint32_t b = Fetch(s + 4);
    uint32_t c = Fetch(s + 8);
    uint32_t d = Fetch(s + 12);
    uint32_t e = Fetch(s + 16);
    h += a;
    g += b;
    f += c;
    h = Mur(d, h) + e;
    g = Mur(c, g) + a;
    f = Mur(b + e * c1, f) + d;
    f += g;
    g += f;
    s += 20;
  } while (--iters != 0);
  g = Rotate(g, 11) * c1;
  g = Rotate(g, 17) * c1;
  f = Rotate(f, 11) * c1;
  f = Rotate(f, 17) * c1;
  h = Rotate(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  h = Rotate(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  return h;
}